

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O3

int do_device(int nargs,char **args)

{
  char cVar1;
  char *__s;
  int iVar2;
  uint uid;
  uint gid;
  size_t sVar3;
  byte *pbVar4;
  byte bVar5;
  mode_t perm;
  
  iVar2 = -1;
  if (nargs == 5) {
    __s = args[1];
    sVar3 = strlen(__s);
    iVar2 = (int)sVar3 + -1;
    perm = 0;
    cVar1 = __s[iVar2];
    if (cVar1 == '*') {
      __s[iVar2] = '\0';
    }
    pbVar4 = (byte *)args[2];
    bVar5 = *pbVar4;
    if (bVar5 != 0) {
      perm = 0;
      do {
        pbVar4 = pbVar4 + 1;
        if ((bVar5 & 0xf8) != 0x30) {
          perm = 0xffffffff;
          break;
        }
        perm = (uint)(byte)(bVar5 - 0x30) + perm * 8;
        bVar5 = *pbVar4;
      } while (bVar5 != 0);
    }
    uid = decode_uid(args[3]);
    gid = decode_uid(args[4]);
    add_devperms_partners(__s,perm,uid,gid,(ushort)(cVar1 == '*'));
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int do_device(int nargs, char **args) {
    int len;
    char tmp[64];
    char *source = args[1];
    int prefix = 0;

    if (nargs != 5)
        return -1;
    /* Check for wildcard '*' at the end which indicates a prefix. */
    len = strlen(args[1]) - 1;
    if (args[1][len] == '*') {
        args[1][len] = '\0';
        prefix = 1;
    }
    /* If path starts with mtd@ lookup the mount number. */
    /*if (!strncmp(source, "mtd@", 4)) {
        int n = mtd_name_to_number(source + 4);
        if (n >= 0) {
            snprintf(tmp, sizeof(tmp), "/dev/mtd/mtd%d", n);
            source = tmp;
        }
    }*/
    add_devperms_partners(source, get_mode(args[2]), decode_uid(args[3]),
                          decode_uid(args[4]), prefix);
    return 0;
}